

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhostinfo.cpp
# Opt level: O0

void __thiscall QHostInfoResult::postResultsReady(QHostInfoResult *this,QHostInfo *info)

{
  bool bVar1;
  QHostInfo *args;
  undefined8 in_RSI;
  offset_in_QHostInfoResult_to_subr *in_RDI;
  long in_FS_OFFSET;
  QHostInfoResult *unaff_retaddr;
  QHostInfoResult *result;
  QHostInfo *in_stack_ffffffffffffffb8;
  QHostInfoResult *in_stack_ffffffffffffffc0;
  ConnectionType type;
  QHostInfoResult *other;
  
  type = (ConnectionType)((ulong)in_RSI >> 0x20);
  other = *(QHostInfoResult **)(in_FS_OFFSET + 0x28);
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter> *)
                     0x21be73);
  if (bVar1) {
    bVar1 = QPointer::operator_cast_to_bool((QPointer<const_QObject> *)0x21be96);
    if (bVar1) {
      args = (QHostInfo *)operator_new(0x28);
      QHostInfoResult(unaff_retaddr,other);
      qt_noop();
      QMetaObject::invokeMethod<void(QHostInfoResult::*)(QHostInfo_const&),QHostInfo_const&>
                ((ContextType *)finalizePostResultsReady,in_RDI,type,args);
    }
  }
  else {
    resultsReady(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  }
  if (*(QHostInfoResult **)(in_FS_OFFSET + 0x28) != other) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QHostInfoResult::postResultsReady(const QHostInfo &info)
{
    // queued connection will take care of dispatching to right thread
    if (!slotObj) {
        emit resultsReady(info);
        return;
    }
    // we used to have a context object, but it's already destroyed
    if (!receiver)
        return;

    // a long-living version of this
    auto result = new QHostInfoResult(this);
    Q_CHECK_PTR(result);

    QMetaObject::invokeMethod(result,
                              &QHostInfoResult::finalizePostResultsReady,
                              Qt::QueuedConnection,
                              info);
}